

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_digest.hpp
# Opt level: O2

void __thiscall duckdb_tdigest::TDigest::process(TDigest *this)

{
  double dVar1;
  const_iterator __position;
  pointer pCVar2;
  Centroid *centroid;
  pointer pCVar3;
  ulong uVar4;
  ulong uVar5;
  Value VVar6;
  double dVar7;
  double local_30;
  double local_28;
  Centroid *__args;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
            ((this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->unprocessed_).
       super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
  insert<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid_const*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,void>
            ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
             &this->unprocessed_,__position,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->processed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  pCVar3 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::
  __inplace_merge<__gnu_cxx::__normal_iterator<duckdb_tdigest::Centroid*,std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>>,__gnu_cxx::__ops::_Iter_comp_iter<duckdb_tdigest::CentroidComparator>>
            (pCVar3,(long)__position._M_current + ((long)pCVar3 - (long)pCVar2),
             (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  this->processedWeight_ = this->unprocessedWeight_ + this->processedWeight_;
  this->unprocessedWeight_ = 0.0;
  pCVar2 = (this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->processed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->processed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  std::vector<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>::push_back
            (&this->processed_,
             (this->unprocessed_).
             super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
             ._M_impl.super__Vector_impl_data._M_start);
  local_28 = ((this->unprocessed_).
              super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
              ._M_impl.super__Vector_impl_data._M_start)->weight_;
  local_30 = this->processedWeight_;
  VVar6 = integratedQ(this,1.0);
  local_30 = VVar6 * local_30;
  pCVar2 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pCVar3 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    __args = pCVar3 + 1;
    if (pCVar2 <= __args) break;
    dVar7 = pCVar3[1].weight_ + local_28;
    if (local_30 < dVar7) {
      VVar6 = integratedLocation(this,local_28 / this->processedWeight_);
      local_30 = this->processedWeight_;
      VVar6 = integratedQ(this,VVar6 + 1.0);
      local_30 = VVar6 * local_30;
      local_28 = local_28 + pCVar3[1].weight_;
      std::vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>>::
      emplace_back<duckdb_tdigest::Centroid_const&>
                ((vector<duckdb_tdigest::Centroid,std::allocator<duckdb_tdigest::Centroid>> *)
                 &this->processed_,__args);
      pCVar3 = __args;
    }
    else {
      Centroid::add((this->processed_).
                    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1,__args);
      pCVar3 = __args;
      local_28 = dVar7;
    }
  }
  pCVar2 = (this->unprocessed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->unprocessed_).
      super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar2) {
    (this->unprocessed_).
    super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>._M_impl.
    super__Vector_impl_data._M_finish = pCVar2;
  }
  dVar7 = ((this->processed_).
           super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
           _M_impl.super__Vector_impl_data._M_start)->mean_;
  dVar1 = (this->processed_).
          super__Vector_base<duckdb_tdigest::Centroid,_std::allocator<duckdb_tdigest::Centroid>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1].mean_;
  uVar4 = -(ulong)(dVar7 < this->min_);
  uVar5 = -(ulong)(this->max_ < dVar1);
  this->min_ = (Value)(~uVar4 & (ulong)this->min_ | (ulong)dVar7 & uVar4);
  this->max_ = (Value)(~uVar5 & (ulong)this->max_ | (ulong)dVar1 & uVar5);
  updateCumulative(this);
  return;
}

Assistant:

inline void process() {
		CentroidComparator cc;
		std::sort(unprocessed_.begin(), unprocessed_.end(), cc);
		auto count = unprocessed_.size();
		unprocessed_.insert(unprocessed_.end(), processed_.cbegin(), processed_.cend());
		std::inplace_merge(unprocessed_.begin(), unprocessed_.begin() + int64_t(count), unprocessed_.end(), cc);

		processedWeight_ += unprocessedWeight_;
		unprocessedWeight_ = 0;
		processed_.clear();

		processed_.push_back(unprocessed_[0]);
		Weight wSoFar = unprocessed_[0].weight();
		Weight wLimit = processedWeight_ * integratedQ(1.0);

		auto end = unprocessed_.end();
		for (auto iter = unprocessed_.cbegin() + 1; iter < end; iter++) {
			auto &centroid = *iter;
			Weight projectedW = wSoFar + centroid.weight();
			if (projectedW <= wLimit) {
				wSoFar = projectedW;
				(processed_.end() - 1)->add(centroid);
			} else {
				auto k1 = integratedLocation(wSoFar / processedWeight_);
				wLimit = processedWeight_ * integratedQ(k1 + 1.0);
				wSoFar += centroid.weight();
				processed_.emplace_back(centroid);
			}
		}
		unprocessed_.clear();
		min_ = std::min(min_, processed_[0].mean());
		max_ = std::max(max_, (processed_.cend() - 1)->mean());
		updateCumulative();
	}